

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

Test * anon_unknown.dwarf_102615::StatTestSimple::Create(void)

{
  StatTest *this;
  
  this = (StatTest *)operator_new(0x1b0);
  StatTest::StatTest(this);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__StatTest_001f9298;
  (this->super_DiskInterface).super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__StatTestSimple_001f92f8;
  g_current_test = (Test *)this;
  return (Test *)this;
}

Assistant:

TEST_F(StatTest, Simple) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat in\n"));

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_EQ(2u, stats_.size());
  ASSERT_EQ("out", stats_[0]);
  ASSERT_EQ("in",  stats_[1]);
}